

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::renderTestPatternReference(PixelBufferAccess *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pVVar4;
  int y;
  int y_00;
  int iVar5;
  int x;
  int x_00;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> rects;
  tcu local_40 [16];
  
  tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)&rects,dst,MODE_STENCIL);
  tcu::getTextureFormatBitDepth(local_40,(TextureFormat *)&rects);
  rects.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rects.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rects.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((dst->super_ConstPixelBufferAccess).m_format.order == DS) {
    tcu::clearDepth(dst,0.0);
  }
  tcu::clearStencil(dst,0);
  genTestRects(&rects,(dst->super_ConstPixelBufferAccess).m_size.m_data[0],
               (dst->super_ConstPixelBufferAccess).m_size.m_data[1]);
  for (pVVar4 = rects.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar4 != rects.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar4 = pVVar4 + 1) {
    iVar1 = pVVar4->m_data[0];
    y_00 = pVVar4->m_data[1];
    iVar2 = pVVar4->m_data[2];
    iVar5 = pVVar4->m_data[3] + y_00;
    for (; x_00 = iVar1, y_00 < iVar5; y_00 = y_00 + 1) {
      for (; x_00 < iVar2 + iVar1; x_00 = x_00 + 1) {
        iVar3 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&dst->super_ConstPixelBufferAccess,x_00,y_00,0);
        tcu::PixelBufferAccess::setPixStencil
                  (dst,iVar3 + 1U & ~(-1 << ((byte)local_40[0] & 0x1f)),x_00,y_00,0);
      }
    }
  }
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&rects.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
  return;
}

Assistant:

static void renderTestPatternReference (const tcu::PixelBufferAccess& dst)
{
	const int		stencilBits		= tcu::getTextureFormatBitDepth(tcu::getEffectiveDepthStencilAccess(dst, tcu::Sampler::MODE_STENCIL).getFormat()).x();
	const deUint32	stencilMask		= (1u<<stencilBits)-1u;
	vector<IVec4>	rects;

	DE_ASSERT(dst.getFormat().order == TextureFormat::S || dst.getFormat().order == TextureFormat::DS);

	// clear depth and stencil
	if (dst.getFormat().order == TextureFormat::DS)
		tcu::clearDepth(dst, 0.0f);
	tcu::clearStencil(dst, 0u);

	genTestRects(rects, dst.getWidth(), dst.getHeight());

	for (vector<IVec4>::const_iterator rectIter = rects.begin(); rectIter != rects.end(); ++rectIter)
	{
		const int	x0		= rectIter->x();
		const int	y0		= rectIter->y();
		const int	x1		= x0+rectIter->z();
		const int	y1		= y0+rectIter->w();

		for (int y = y0; y < y1; y++)
		{
			for (int x = x0; x < x1; x++)
			{
				const int oldVal	= dst.getPixStencil(x, y);
				const int newVal	= (oldVal+1)&stencilMask;

				dst.setPixStencil(newVal, x, y);
			}
		}
	}
}